

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_isPublicId(ENCODING *enc,char *ptr,char *end,char **badPtr)

{
  char *pcVar1;
  char *pcVar2;
  char cVar3;
  ulong uVar4;
  
  pcVar2 = ptr + 2;
  pcVar1 = end + (-2 - (long)pcVar2);
  do {
    if ((long)pcVar1 < 2) {
      return 1;
    }
    if (*pcVar2 != '\0') goto LAB_0017da9f;
    uVar4 = (ulong)*(byte *)((long)enc[1].scanners + (ulong)(byte)pcVar2[1]);
    if (uVar4 < 0x24) {
      if ((0xfcb8fe600U >> (uVar4 & 0x3f) & 1) == 0) {
        if ((0x4400000UL >> (uVar4 & 0x3f) & 1) == 0) {
          if (uVar4 != 0x15) goto LAB_0017da8b;
          if (pcVar2[1] == '\t') goto LAB_0017da9f;
        }
        else {
          cVar3 = pcVar2[1];
          if (cVar3 < '\0') goto LAB_0017da8f;
        }
      }
    }
    else {
LAB_0017da8b:
      cVar3 = pcVar2[1];
LAB_0017da8f:
      if ((cVar3 != '@') && (cVar3 != '$')) {
LAB_0017da9f:
        *badPtr = pcVar2;
        return 0;
      }
    }
    pcVar2 = pcVar2 + 2;
    pcVar1 = pcVar1 + -2;
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(isPublicId)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **badPtr) {
  ptr += MINBPC(enc);
  end -= MINBPC(enc);
  for (; HAS_CHAR(enc, ptr, end); ptr += MINBPC(enc)) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_DIGIT:
    case BT_HEX:
    case BT_MINUS:
    case BT_APOS:
    case BT_LPAR:
    case BT_RPAR:
    case BT_PLUS:
    case BT_COMMA:
    case BT_SOL:
    case BT_EQUALS:
    case BT_QUEST:
    case BT_CR:
    case BT_LF:
    case BT_SEMI:
    case BT_EXCL:
    case BT_AST:
    case BT_PERCNT:
    case BT_NUM:
#  ifdef XML_NS
    case BT_COLON:
#  endif
      break;
    case BT_S:
      if (CHAR_MATCHES(enc, ptr, ASCII_TAB)) {
        *badPtr = ptr;
        return 0;
      }
      break;
    case BT_NAME:
    case BT_NMSTRT:
      if (! (BYTE_TO_ASCII(enc, ptr) & ~0x7f))
        break;
      /* fall through */
    default:
      switch (BYTE_TO_ASCII(enc, ptr)) {
      case 0x24: /* $ */
      case 0x40: /* @ */
        break;
      default:
        *badPtr = ptr;
        return 0;
      }
      break;
    }
  }
  return 1;
}